

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

bool __thiscall ON_Xform::DecomposeSymmetric(ON_Xform *this,ON_Xform *Q,ON_3dVector *diagonal)

{
  double dVar1;
  bool bVar2;
  ON_Xform local_f8;
  undefined1 local_78 [8];
  ON_3dVector evec [3];
  bool local_21;
  bool symmetric;
  bool rc;
  ON_3dVector *diagonal_local;
  ON_Xform *Q_local;
  ON_Xform *this_local;
  
  local_21 = false;
  bVar2 = IsLinear(this);
  if (bVar2) {
    dVar1 = this->m_xform[0][1];
    bVar2 = false;
    if ((dVar1 == this->m_xform[1][0]) && (!NAN(dVar1) && !NAN(this->m_xform[1][0]))) {
      dVar1 = this->m_xform[0][2];
      bVar2 = false;
      if ((dVar1 == this->m_xform[2][0]) && (!NAN(dVar1) && !NAN(this->m_xform[2][0]))) {
        bVar2 = this->m_xform[1][2] == this->m_xform[2][1];
      }
    }
    if ((bVar2) &&
       (local_21 = ON_Sym3x3EigenSolver
                             (this->m_xform[0][0],this->m_xform[1][1],this->m_xform[2][2],
                              this->m_xform[0][1],this->m_xform[1][2],this->m_xform[0][2],
                              &diagonal->x,(ON_3dVector *)local_78,&diagonal->y,
                              (ON_3dVector *)&evec[0].z,&diagonal->z,(ON_3dVector *)&evec[1].z),
       local_21)) {
      ON_Xform(&local_f8,&ON_3dPoint::Origin,(ON_3dVector *)local_78,(ON_3dVector *)&evec[0].z,
               (ON_3dVector *)&evec[1].z);
      memcpy(Q,&local_f8,0x80);
    }
  }
  return local_21;
}

Assistant:

bool ON_Xform::DecomposeSymmetric(ON_Xform& Q, ON_3dVector& diagonal) const
{
	bool rc = false;
	if (IsLinear())
	{
		bool symmetric  = ( m_xform[0][1] == m_xform[1][0] && 
			m_xform[0][2] == m_xform[2][0] && 
			m_xform[1][2] == m_xform[2][1]  );
		if (symmetric)
		{
			ON_3dVector evec[3];
			rc = ON_Sym3x3EigenSolver(m_xform[0][0], m_xform[1][1], m_xform[2][2],
				m_xform[0][1], m_xform[1][2], m_xform[0][2],
				&diagonal.x, evec[0],
				&diagonal.y, evec[1],
				&diagonal.z, evec[2]);
			if (rc)
			{
				Q = ON_Xform(ON_3dPoint::Origin, evec[0], evec[1], evec[2]);
			}
		}
	}
	return rc;
}